

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

LPCWSTR __thiscall Js::ScopeVariablesGroupDisplay::Value(ScopeVariablesGroupDisplay *this,int radix)

{
  char16 c;
  AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *pAVar1;
  StringBuilder<Memory::ArenaAllocator> *this_00;
  Var pvVar2;
  bool bVar3;
  bool bVar4;
  BOOL BVar5;
  int iVar6;
  FunctionBody *pFVar7;
  undefined4 extraout_var_01;
  undefined7 extraout_var;
  RecyclableObject *originalInstance;
  undefined4 extraout_var_02;
  undefined7 extraout_var_00;
  JavascriptFunction *this_01;
  undefined4 extraout_var_03;
  FunctionInfo *this_02;
  undefined4 extraout_var_04;
  Var local_30;
  Var calleeFunc;
  Var value;
  
  bVar3 = VarIs<Js::ActivationObject>((this->super_RecyclableObjectDisplay).instance);
  if (bVar3) {
    pFVar7 = (FunctionBody *)
             VarTo<Js::RecyclableObject>((this->super_RecyclableObjectDisplay).instance);
    calleeFunc = (Var)0x0;
    pAVar1 = (pFVar7->super_ParseableFunctionInfo).super_FunctionProxy.auxPtrs.ptr;
    bVar3 = true;
    iVar6._0_1_ = pAVar1->count;
    iVar6._1_1_ = pAVar1->capacity;
    iVar6._2_1_ = pAVar1->offsets[0];
    iVar6._3_1_ = pAVar1->offsets[1];
    if (iVar6 == 0x53) {
      BVar5 = RecyclableObjectDisplay::GetPropertyWithScriptEnter
                        ((RecyclableObject *)pFVar7,(RecyclableObject *)pFVar7,0x1cf,&calleeFunc,
                         (this->super_RecyclableObjectDisplay).scriptContext);
      pFVar7 = (FunctionBody *)CONCAT44(extraout_var_01,BVar5);
      if (BVar5 != 0) {
        bVar4 = VarIs<Js::RecyclableObject>(calleeFunc);
        pFVar7 = (FunctionBody *)CONCAT71(extraout_var,bVar4);
        if (bVar4) {
          originalInstance = VarTo<Js::RecyclableObject>(calleeFunc);
          local_30 = (Var)0x0;
          BVar5 = RecyclableObjectDisplay::GetPropertyWithScriptEnter
                            (originalInstance,originalInstance,0x1ce,&local_30,
                             (this->super_RecyclableObjectDisplay).scriptContext);
          pFVar7 = (FunctionBody *)CONCAT44(extraout_var_02,BVar5);
          if (BVar5 != 0) {
            bVar4 = VarIs<Js::JavascriptFunction>(local_30);
            pFVar7 = (FunctionBody *)CONCAT71(extraout_var_00,bVar4);
            if (bVar4) {
              this_01 = VarTo<Js::JavascriptFunction>(local_30);
              pFVar7 = JavascriptFunction::GetFunctionBody(this_01);
              if (pFVar7 != (FunctionBody *)0x0) {
                iVar6 = (*(pFVar7->super_ParseableFunctionInfo).super_FunctionProxy.
                          super_FinalizableObject.super_IRecyclerVisitedObject.
                          _vptr_IRecyclerVisitedObject[7])(pFVar7);
                pFVar7 = (FunctionBody *)CONCAT44(extraout_var_03,iVar6);
                bVar3 = pFVar7 == (FunctionBody *)0x0;
                if (!bVar3) {
                  this_00 = ((this->super_RecyclableObjectDisplay).scriptContext)->threadContext->
                            debugManager->pCurrentInterpreterLocation->stringBuilder;
                  this_00->length = 0;
                  this_00->count = 0;
                  this_00->firstChunk = (Data *)0x0;
                  this_00->secondChunk = (Data *)0x0;
                  this_00->lastChunk = (Data *)0x0;
                  c = *(char16 *)
                       &(pFVar7->super_ParseableFunctionInfo).super_FunctionProxy.
                        super_FinalizableObject.super_IRecyclerVisitedObject.
                        _vptr_IRecyclerVisitedObject;
                  while (c != L'\0') {
                    pFVar7 = (FunctionBody *)
                             ((long)&(pFVar7->super_ParseableFunctionInfo).super_FunctionProxy.
                                     super_FinalizableObject.super_IRecyclerVisitedObject.
                                     _vptr_IRecyclerVisitedObject + 2);
                    StringBuilder<Memory::ArenaAllocator>::Append(this_00,c);
                    c = *(char16 *)
                         &(pFVar7->super_ParseableFunctionInfo).super_FunctionProxy.
                          super_FinalizableObject.super_IRecyclerVisitedObject.
                          _vptr_IRecyclerVisitedObject;
                  }
                  pFVar7 = (FunctionBody *)StringBuilder<Memory::ArenaAllocator>::Detach(this_00);
                }
              }
            }
          }
        }
      }
    }
    if (!bVar3) {
      return (LPCWSTR)pFVar7;
    }
  }
  else {
    pvVar2 = (this->super_RecyclableObjectDisplay).instance;
    Memory::Recycler::WBSetBit((char *)&calleeFunc);
    calleeFunc = pvVar2;
    Memory::RecyclerWriteBarrierManager::WriteBarrier((ScopeSlots *)&calleeFunc);
    bVar3 = ScopeSlots::IsDebuggerScopeSlotArray((ScopeSlots *)&calleeFunc);
    if (!bVar3) {
      this_02 = ScopeSlots::GetFunctionInfo((ScopeSlots *)&calleeFunc);
      pFVar7 = FunctionInfo::GetFunctionBody(this_02);
      iVar6 = (*(pFVar7->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(pFVar7);
      return (LPCWSTR)CONCAT44(extraout_var_04,iVar6);
    }
  }
  return L"";
}

Assistant:

LPCWSTR ScopeVariablesGroupDisplay::Value(int radix)
    {
        if (VarIs<ActivationObject>(instance))
        {
            // The scope is defined by the activation object.
            Js::RecyclableObject *object = Js::VarTo<Js::RecyclableObject>(instance);
            try
            {
                // Trying to find out the JavascriptFunction from the scope.
                Var value = nullptr;
                if (object->GetTypeId() == TypeIds_ActivationObject && GetPropertyWithScriptEnter(object, object, PropertyIds::arguments, &value, scriptContext))
                {
                    if (Js::VarIs<Js::RecyclableObject>(value))
                    {
                        Js::RecyclableObject *argObject = Js::VarTo<Js::RecyclableObject>(value);
                        Var calleeFunc = nullptr;
                        if (GetPropertyWithScriptEnter(argObject, argObject, PropertyIds::callee, &calleeFunc, scriptContext) && Js::VarIs<Js::JavascriptFunction>(calleeFunc))
                        {
                            Js::JavascriptFunction *calleeFunction = Js::VarTo<Js::JavascriptFunction>(calleeFunc);
                            Js::FunctionBody *pFuncBody = calleeFunction->GetFunctionBody();

                            if (pFuncBody)
                            {
                                const char16* pDisplayName = pFuncBody->GetDisplayName();
                                if (pDisplayName)
                                {
                                    StringBuilder<ArenaAllocator>* builder = GetStringBuilder();
                                    builder->Reset();
                                    builder->AppendSz(pDisplayName);
                                    return builder->Detach();
                                }
                            }
                        }
                    }
                }
            }
            catch(const JavascriptException& err)
            {
                err.GetAndClear();  // discard exception object
            }

            return _u("");
        }
        else
        {
            // The scope is defined by a slot array object so grab the function body out to get the function name.
            ScopeSlots slotArray = ScopeSlots(reinterpret_cast<Field(Var)*>(instance));

            if(slotArray.IsDebuggerScopeSlotArray())
            {
                // handling for block/catch scope
                return _u("");
            }
            else
            {
                Js::FunctionBody *functionBody = slotArray.GetFunctionInfo()->GetFunctionBody();
                return functionBody->GetDisplayName();
            }
        }
    }